

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invocation_interlock_placement_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::InvocationInterlockPlacementPass::placeInstructionsForEdge
          (InvocationInterlockPlacementPass *this,BasicBlock *block,uint32_t next_id,
          BlockSet *inside,BlockSet *previous_inside,Op opcode,bool reverse_cfg)

{
  bool bVar1;
  uint32_t uVar2;
  size_type sVar3;
  long *plVar4;
  CFG *this_00;
  BasicBlock *pBVar5;
  Instruction *this_01;
  bool next_has_previous_inside;
  uint32_t next_id_local;
  uint32_t local_9c;
  Op local_98;
  uint local_94;
  Function *local_90;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_88;
  _Any_data local_50;
  pointer local_40;
  code *local_38;
  
  next_id_local = next_id;
  sVar3 = std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count(&previous_inside->_M_h,&next_id_local);
  if (sVar3 != 0) {
    uVar2 = BasicBlock::id(block);
    local_90 = (Function *)CONCAT44(local_90._4_4_,uVar2);
    sVar3 = std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&inside->_M_h,(key_type *)&local_90);
    if (sVar3 == 0) {
      uVar2 = BasicBlock::id(block);
      bVar1 = hasSingleNextBlock(this,uVar2,reverse_cfg);
      if (bVar1) {
        local_90 = (Function *)&next_has_previous_inside;
        next_has_previous_inside = false;
        local_9c = next_id_local;
        local_98 = opcode;
        local_94 = (uint)reverse_cfg;
        std::
        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::_Hashtable(&local_88,&inside->_M_h);
        local_50._8_8_ = 0;
        plVar4 = (long *)::operator_new(0x40);
        *plVar4 = (long)local_90;
        std::
        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      *)(plVar4 + 1),&local_88);
        local_38 = std::
                   _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/invocation_interlock_placement_pass.cpp:355:19)>
                   ::_M_invoke;
        local_40 = (pointer)std::
                            _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/invocation_interlock_placement_pass.cpp:355:19)>
                            ::_M_manager;
        local_50._M_unused._M_object = plVar4;
        forEachNext(this,local_9c,!reverse_cfg,(function<void_(unsigned_int)> *)&local_50);
        if (local_40 != (pointer)0x0) {
          (*(code *)local_40)(&local_50,&local_50,3);
        }
        std::
        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable(&local_88);
        if (next_has_previous_inside == false) {
          __assert_fail("next_has_previous_inside && \"`previous_inside` must be the set of blocks with at least one \" \"previous block in `inside`\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/invocation_interlock_placement_pass.cpp"
                        ,0x16a,
                        "bool spvtools::opt::InvocationInterlockPlacementPass::placeInstructionsForEdge(BasicBlock *, uint32_t, BlockSet &, BlockSet &, spv::Op, bool)"
                       );
        }
        addInstructionAtBlockBoundary(this,block,local_98,SUB41(local_94,0));
      }
      else {
        uVar2 = next_id_local;
        if (!reverse_cfg) {
          this_00 = Pass::cfg(&this->super_Pass);
          pBVar5 = CFG::block(this_00,next_id_local);
          uVar2 = BasicBlock::id(block);
          block = pBVar5;
        }
        splitEdge(this,block,uVar2);
        this_01 = (Instruction *)::operator_new(0x70);
        Instruction::Instruction(this_01,(this->super_Pass).context_,opcode);
        BasicBlock::tail((BasicBlock *)&local_90);
        utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore
                  ((IntrusiveNodeBase<spvtools::opt::Instruction> *)this_01,(Instruction *)local_90)
        ;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool InvocationInterlockPlacementPass::placeInstructionsForEdge(
    BasicBlock* block, uint32_t next_id, BlockSet& inside,
    BlockSet& previous_inside, spv::Op opcode, bool reverse_cfg) {
  bool modified = false;

  if (previous_inside.count(next_id) && !inside.count(block->id())) {
    // This block is not in the critical section but the next has at least one
    // other previous block that is, so this block should be enter it as well.
    // We need to add begin or end instructions to the edge.

    modified = true;

    if (hasSingleNextBlock(block->id(), reverse_cfg)) {
      // This is the only next block.

      // Additionally, because `next_id` is in `previous_inside`, we know that
      // `next_id` has at least one previous block in `inside`. And because
      // 'block` is not in `inside`, that means the `next_id` has to have at
      // least one other previous block in `inside`.

      // This is solely for a debug assertion. It is essentially recomputing the
      // value of `previous_inside` to verify that it was computed correctly
      // such that the above statement is true.
      bool next_has_previous_inside = false;
      // By passing !reverse_cfg to forEachNext, we are actually iterating over
      // the previous blocks.
      forEachNext(next_id, !reverse_cfg,
                  [&next_has_previous_inside, inside](uint32_t previous_id) {
                    if (inside.count(previous_id)) {
                      next_has_previous_inside = true;
                    }
                  });
      assert(next_has_previous_inside &&
             "`previous_inside` must be the set of blocks with at least one "
             "previous block in `inside`");

      addInstructionAtBlockBoundary(block, opcode, reverse_cfg);
    } else {
      // This block has multiple next blocks. Split the edge and insert the
      // instruction in the new next block.
      BasicBlock* new_branch;
      if (reverse_cfg) {
        new_branch = splitEdge(block, next_id);
      } else {
        new_branch = splitEdge(cfg()->block(next_id), block->id());
      }

      auto inst = new Instruction(context(), opcode);
      inst->InsertBefore(&*new_branch->tail());
    }
  }

  return modified;
}